

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O2

int __thiscall ncnn::Scale::load_model(Scale *this,ModelBin *mb)

{
  int iVar1;
  Mat MStack_68;
  
  iVar1 = 0;
  if (this->scale_data_size != 0xffffff17) {
    (*mb->_vptr_ModelBin[2])(&MStack_68,mb,(ulong)(uint)this->scale_data_size,1);
    Mat::operator=(&this->scale_data,&MStack_68);
    Mat::~Mat(&MStack_68);
    iVar1 = -100;
    if (((this->scale_data).data != (void *)0x0) &&
       ((long)(this->scale_data).c * (this->scale_data).cstep != 0)) {
      if (this->bias_term != 0) {
        (*mb->_vptr_ModelBin[2])(&MStack_68,mb,(ulong)(uint)this->scale_data_size,1);
        Mat::operator=(&this->bias_data,&MStack_68);
        Mat::~Mat(&MStack_68);
        if ((this->bias_data).data == (void *)0x0) {
          return -100;
        }
        if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
          return -100;
        }
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int Scale::load_model(const ModelBin& mb)
{
    if (scale_data_size == -233)
        return 0;

    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(scale_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}